

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::TEST_CompactRange(DBImpl *this,int level,Slice *begin,Slice *end)

{
  string *psVar1;
  MutexLock l;
  InternalKey end_storage;
  InternalKey begin_storage;
  undefined1 local_60 [24];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  if (level < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_impl.cc"
                  ,0x247,
                  "void leveldb::DBImpl::TEST_CompactRange(int, const Slice *, const Slice *)");
  }
  if ((uint)level < 6) {
    begin_storage.rep_._M_dataplus._M_p = (pointer)&begin_storage.rep_.field_2;
    begin_storage.rep_._M_string_length = 0;
    psVar1 = (string *)0x0;
    end_storage.rep_._M_dataplus._M_p = (pointer)&end_storage.rep_.field_2;
    end_storage.rep_._M_string_length = 0;
    begin_storage.rep_.field_2._M_local_buf[0] = '\0';
    end_storage.rep_.field_2._M_local_buf[0] = '\0';
    local_48._M_p = (pointer)&local_38;
    local_40 = 0;
    local_38._M_local_buf[0] = '\0';
    local_60[4] = false;
    local_60._0_4_ = level;
    if (begin != (Slice *)0x0) {
      InternalKey::InternalKey((InternalKey *)&l,begin,0xffffffffffffff,kTypeValue);
      psVar1 = (string *)&begin_storage;
      std::__cxx11::string::operator=(psVar1,(string *)&l);
      std::__cxx11::string::~string((string *)&l);
    }
    local_60._8_8_ = psVar1;
    if (end == (Slice *)0x0) {
      psVar1 = (string *)0x0;
    }
    else {
      InternalKey::InternalKey((InternalKey *)&l,end,0,kTypeDeletion);
      psVar1 = (string *)&end_storage;
      std::__cxx11::string::operator=(psVar1,(string *)&l);
      std::__cxx11::string::~string((string *)&l);
    }
    l.mu_ = &this->mutex_;
    local_60._16_8_ = psVar1;
    port::Mutex::Lock(l.mu_);
    while ((local_60[4] == false &&
           ((this->shutting_down_).rep_ == (void *)0x0 && (this->bg_error_).state_ == (char *)0x0)))
    {
      if (this->manual_compaction_ == (ManualCompaction *)0x0) {
        this->manual_compaction_ = (ManualCompaction *)local_60;
        MaybeScheduleCompaction(this);
      }
      else {
        port::CondVar::Wait(&this->bg_cv_);
      }
    }
    if (this->manual_compaction_ == (ManualCompaction *)local_60) {
      this->manual_compaction_ = (ManualCompaction *)0x0;
    }
    MutexLock::~MutexLock(&l);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&end_storage);
    std::__cxx11::string::~string((string *)&begin_storage);
    return;
  }
  __assert_fail("level + 1 < config::kNumLevels",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_impl.cc"
                ,0x248,"void leveldb::DBImpl::TEST_CompactRange(int, const Slice *, const Slice *)")
  ;
}

Assistant:

void DBImpl::TEST_CompactRange(int level, const Slice *begin, const Slice *end) {
  assert(level >= 0);
  assert(level + 1 < config::kNumLevels);

  InternalKey begin_storage, end_storage;

  ManualCompaction manual;
  manual.level = level;
  manual.done = false;
  if (begin==NULL) {
    manual.begin = NULL;
  } else {
    begin_storage = InternalKey(*begin, kMaxSequenceNumber, kValueTypeForSeek);
    manual.begin = &begin_storage;
  }
  if (end==NULL) {
    manual.end = NULL;
  } else {
    end_storage = InternalKey(*end, 0, static_cast<ValueType>(0));
    manual.end = &end_storage;
  }

  MutexLock l(&mutex_);
  while (!manual.done && !shutting_down_.Acquire_Load() && bg_error_.ok()) {
    if (manual_compaction_==NULL) {  // Idle
      manual_compaction_ = &manual;
      MaybeScheduleCompaction();
    } else {  // Running either my compaction or another compaction.
      bg_cv_.Wait();
    }
  }
  if (manual_compaction_==&manual) {
    // Cancel my manual compaction since we aborted early for some reason.
    manual_compaction_ = NULL;
  }
}